

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O3

void Io_ReadPlaMarkIdentical(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  ulong uVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t __size;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  
  iVar10 = nCubes >> 5;
  if (vMarks->nCap < nCubes) {
    iVar11 = (iVar10 + 1) - (uint)((nCubes & 0x1fU) == 0);
    __size = (long)iVar11 << 2;
    if (vMarks->pArray == (int *)0x0) {
      piVar3 = (int *)malloc(__size);
    }
    else {
      piVar3 = (int *)realloc(vMarks->pArray,__size);
    }
    vMarks->pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
    }
    vMarks->nCap = iVar11 * 0x20;
  }
  uVar2 = (uint)((nCubes & 0x1fU) != 0);
  iVar11 = iVar10 + uVar2;
  if (iVar11 != 0 && SCARRY4(iVar10,uVar2) == iVar11 < 0) {
    memset(vMarks->pArray,0,(ulong)(iVar11 - 1) * 4 + 4);
  }
  vMarks->nSize = iVar11 * 0x20;
  if (0 < nCubes) {
    uVar5 = (ulong)(uint)nCubes;
    uVar7 = 1;
    uVar8 = 0;
    do {
      if ((long)vMarks->nSize <= (long)uVar8) {
LAB_00331fa0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      piVar3 = vMarks->pArray;
      uVar1 = uVar8 + 1;
      uVar4 = uVar7;
      if (uVar1 < uVar5 && ((uint)piVar3[uVar8 >> 5 & 0x7ffffff] >> ((uint)uVar8 & 0x1f) & 1) == 0)
      {
        do {
          if ((long)vMarks->nSize <= (long)uVar4) goto LAB_00331fa0;
          uVar9 = uVar4 >> 5 & 0x7ffffff;
          if (((uint)piVar3[uVar9] >> ((uint)uVar4 & 0x1f) & 1) == 0) {
            if (0 < nWords) {
              uVar6 = 0;
              do {
                if (pCs[uVar8][uVar6] != pCs[uVar4][uVar6]) goto LAB_00331f7a;
                uVar6 = uVar6 + 1;
              } while ((uint)nWords != uVar6);
            }
            piVar3[uVar9] = piVar3[uVar9] | 1 << ((byte)uVar4 & 0x1f);
          }
LAB_00331f7a:
          uVar4 = uVar4 + 1;
        } while (uVar4 != uVar5);
      }
      uVar7 = uVar7 + 1;
      uVar8 = uVar1;
    } while (uVar1 != uVar5);
  }
  return;
}

Assistant:

void Io_ReadPlaMarkIdentical( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c2;
    Vec_BitFill( vMarks, nCubes, 0 );
    for ( c1 = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
            for ( c2 = c1 + 1; c2 < nCubes; c2++ )
                if ( !Vec_BitEntry(vMarks, c2) )
                    if ( Abc_TtEqual(pCs[c1], pCs[c2], nWords) )
                        Vec_BitWriteEntry( vMarks, c2, 1 );
}